

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall
SharedObjectsTest_Test4_Test::SharedObjectsTest_Test4_Test(SharedObjectsTest_Test4_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00189bc0;
  return;
}

Assistant:

TEST(SharedObjectsTest, Test4){
    Infector::Container ioc;
    ioc.bindSingleAs<CFooBar, IFoo, IBar>();
    ioc.bindSingleAsNothing<FooBarUser>();

    ioc.wire<CFooBar>();
    ioc.wire<FooBarUser, IFoo, IBar>();

    try{
        auto user = ioc.buildSingle<FooBarUser>();
        user->doSomething();
    }
    catch(std::exception &ex){
        std::cout<<ex.what()<<std::endl;
    }
}